

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void err_msg<unsigned_char,long>(string *msg,uchar t,long u,bool expected)

{
  ostream *poVar1;
  byte in_CL;
  string *in_RDI;
  undefined7 in_stack_00000118;
  uint8_t in_stack_0000011f;
  string local_70 [48];
  string local_40 [39];
  byte local_19;
  
  local_19 = in_CL & 1;
  poVar1 = std::operator<<((ostream *)&std::cerr,in_RDI);
  to_hex<unsigned_char>(in_stack_0000011f);
  poVar1 = std::operator<<(poVar1,local_40);
  poVar1 = std::operator<<(poVar1,", ");
  to_hex<long>(CONCAT17(in_stack_0000011f,in_stack_00000118));
  poVar1 = std::operator<<(poVar1,local_70);
  poVar1 = std::operator<<(poVar1,", expected = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_19 & 1));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void err_msg(const std::string& msg, T t, U u, bool expected)
{
	std::cerr << msg << to_hex(t) << ", " << to_hex(u) << ", expected = " << expected << std::endl;
}